

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::WebSocket_*> * __thiscall
asl::Array<asl::WebSocket_*>::insert(Array<asl::WebSocket_*> *this,int k,WebSocket **x)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  WebSocket **ppWVar4;
  WebSocket **ppWVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  
  ppWVar5 = this->_a;
  iVar1 = *(int *)(ppWVar5 + -2);
  iVar2 = *(int *)((long)ppWVar5 + -0xc);
  iVar7 = k;
  if (k < 0) {
    iVar7 = iVar1;
  }
  if (iVar1 < iVar2) {
    ppWVar4 = ppWVar5 + -2;
LAB_0012d90a:
    if (iVar1 - iVar7 != 0 && iVar7 <= iVar1) {
      memmove(ppWVar5 + (long)iVar7 + 1,ppWVar5 + iVar7,(long)(iVar1 - iVar7) << 3);
      ppWVar5 = this->_a;
    }
    ppWVar5[iVar7] = *x;
    *(int *)ppWVar4 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    uVar3 = *(undefined4 *)(this->_a + -1);
    iVar8 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar8 = iVar2 * 2 + 2;
    }
    ppWVar4 = (WebSocket **)realloc(this->_a + -2,(long)iVar8 * 8 + 0x10);
    if (ppWVar4 != (WebSocket **)0x0) {
      ppWVar5 = ppWVar4 + 2;
      this->_a = ppWVar5;
      *(int *)((long)ppWVar4 + 4) = iVar8;
      *(undefined4 *)(ppWVar4 + 1) = uVar3;
      goto LAB_0012d90a;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}